

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::MapHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_24_3_af332ec1_for_newObjectCreationFunction_conflict newObjectCreationFunction;
  CallInfo CVar2;
  byte bVar3;
  RecyclableObject *constructor_00;
  JavascriptFunction *pJVar4;
  Var pvVar5;
  bool bVar6;
  BOOL succeeded;
  uint32 uVar7;
  int iVar8;
  ThreadContext *pTVar9;
  Var pvVar10;
  undefined4 *puVar11;
  JavascriptLibrary *pJVar12;
  JavascriptMethod p_Var13;
  Var pvVar14;
  unsigned_long *puVar15;
  undefined4 extraout_var;
  TypedArrayBase *local_280;
  undefined1 local_150 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  ulong uStack_138;
  uint32 k_1;
  uint local_12c;
  TypedArrayBase *pTStack_128;
  uint32 end;
  TypedArrayBase *newTypedArray;
  CallInfo local_118;
  CallInfo local_110;
  undefined1 local_108 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  BOOL gotItem;
  uint32 k;
  CallInfo callBackFnInfo;
  Var mappedValue;
  Var element;
  Arguments *pAStack_d0;
  bool local_c8;
  undefined7 uStack_c7;
  byte local_b9;
  RecyclableObject *pRStack_b8;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  Var thisArg;
  RecyclableObject *callBackFn;
  bool isBuiltinArrayCtor;
  JavascriptArray *pJStack_90;
  bool isTypedArrayEntryPoint;
  JavascriptArray *newArr;
  RecyclableObject *newObj;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  JavascriptArray *local_18;
  
  jsReentLock._24_8_ = scriptContext;
  args_local = (Arguments *)length;
  length_local = (unsigned_long)obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar9 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar9);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,typedArrayBase_local);
  newArr = (JavascriptArray *)0x0;
  pJStack_90 = (JavascriptArray *)0x0;
  callBackFn._7_1_ = obj_local != (RecyclableObject *)0x0;
  callBackFn._6_1_ = 1;
  if ((SUB84(args->Info,0) & 0xffffff) < 2) {
LAB_01102d25:
    if ((callBackFn._7_1_ & 1) != 0) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.map");
    }
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.map");
  }
  pvVar10 = Arguments::operator[](args,1);
  bVar6 = JavascriptConversion::IsCallable(pvVar10);
  if (!bVar6) goto LAB_01102d25;
  pvVar10 = Arguments::operator[](args,1);
  thisArg = VarTo<Js::RecyclableObject>(pvVar10);
  if ((SUB84(args->Info,0) & 0xffffff) < 3) {
    pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    defaultConstructor =
         (JavascriptFunction *)
         JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
  }
  else {
    defaultConstructor = (JavascriptFunction *)Arguments::operator[](args,2);
  }
  if ((((callBackFn._7_1_ & 1) == 0) && (typedArrayBase_local == (TypedArrayBase *)0x0)) &&
     (bVar6 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)length_local),
     bVar6)) {
    obj_local = (RecyclableObject *)
                UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                          ((RecyclableObject *)length_local);
  }
  if ((callBackFn._7_1_ & 1) == 0) {
    JsReentLock::unlock((JsReentLock *)local_70);
    newArr = (JavascriptArray *)
             ArraySpeciesCreate<unsigned_long>
                       ((Var)length_local,(unsigned_long)args_local,
                        (ScriptContext *)jsReentLock._24_8_,(bool *)0x0,(bool *)0x0,
                        (bool *)((long)&callBackFn + 6));
    JsReentLock::relock((JsReentLock *)local_70);
  }
  else {
    pvVar10 = Arguments::operator[](args,0);
    constructor = (RecyclableObject *)
                  Js::TypedArrayBase::GetDefaultConstructor
                            (pvVar10,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::unlock((JsReentLock *)local_70);
    pRStack_b8 = Js::JavascriptOperators::SpeciesConstructor
                           (obj_local,(JavascriptFunction *)constructor,
                            (ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    JsReentLock::relock((JsReentLock *)local_70);
    callBackFn._6_1_ = 0;
    bVar6 = Js::JavascriptOperators::IsConstructor(pRStack_b8);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    local_b9 = pRStack_b8 == constructor;
    JsReentLock::unlock((JsReentLock *)local_70);
    constructor_00 = pRStack_b8;
    bVar3 = local_b9;
    pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    element = pRStack_b8;
    pAStack_d0 = args_local;
    local_c8 = jsReentLock.m_savedNoJsReentrancy;
    uStack_c7 = jsReentLock._25_7_;
    newObjectCreationFunction.length = (unsigned_long)args_local;
    newObjectCreationFunction.constructor = pRStack_b8;
    newObjectCreationFunction.scriptContext = (ScriptContext *)jsReentLock._24_8_;
    pvVar10 = Js::JavascriptOperators::
              NewObjectCreationHelper_ReentrancySafe<Js::JavascriptArray::MapHelper<unsigned_long>(Js::JavascriptArray*,Js::TypedArrayBase*,Js::RecyclableObject*,unsigned_long,Js::Arguments&,Js::ScriptContext*)::_lambda()_1_>
                        (constructor_00,(bool)(bVar3 & 1),pTVar9,newObjectCreationFunction);
    newArr = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar10);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    JsReentLock::relock((JsReentLock *)local_70);
  }
  if (newArr == (JavascriptArray *)0x0) {
    if ((Arguments *)0xffffffff < args_local) {
      JavascriptError::ThrowRangeError((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pJStack_90 = JavascriptLibrary::CreateArray(pJVar12,(uint32)args_local);
    EnsureHead<void*>(pJStack_90);
    newArr = pJStack_90;
  }
  else {
    pJStack_90 = TryVarToNonES5Array(newArr);
    if (pJStack_90 != (JavascriptArray *)0x0) {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJStack_90);
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_70,pJStack_90);
    }
  }
  mappedValue = (Var)0x0;
  callBackFnInfo = (CallInfo)0x0;
  CallInfo::CallInfo((CallInfo *)&gotItem,CallFlags_Value,4);
  if (newArr == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x25fc,"(newObj)","newObj");
    if (!bVar6) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if ((typedArrayBase_local != (TypedArrayBase *)0x0) &&
     (bVar6 = IsNonES5Array((Var)length_local), !bVar6)) {
    bVar6 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)length_local);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2602,"(VarIs<ES5Array>(obj))",
                                  "The array should have been converted to an ES5Array");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    typedArrayBase_local = (TypedArrayBase *)0x0;
  }
  if (typedArrayBase_local == (TypedArrayBase *)0x0) {
    if (obj_local == (RecyclableObject *)0x0) {
      JsReentLock::unlock((JsReentLock *)local_70);
      pArr_local = (JavascriptArray *)
                   MapObjectHelper<unsigned_long>
                             ((RecyclableObject *)length_local,(unsigned_long)args_local,0,
                              (RecyclableObject *)newArr,pJStack_90,(bool)(callBackFn._6_1_ & 1),
                              (RecyclableObject *)thisArg,defaultConstructor,
                              (ScriptContext *)jsReentLock._24_8_);
      goto LAB_01103d44;
    }
    bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
    if (!bVar6) {
      bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar6) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    local_18 = newArr;
    bVar6 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)newArr);
    if (bVar6) {
      local_280 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_18)
      ;
    }
    else {
      local_280 = (TypedArrayBase *)0x0;
    }
    pTStack_128 = local_280;
    if ((local_280 == (TypedArrayBase *)0x0) && (pJStack_90 == (JavascriptArray *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
      Throw::FatalInternalError(-0x7fffbffb);
    }
    if ((Arguments *)0xffffffff < args_local) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x263c,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    uVar7 = ArrayObject::GetLength((ArrayObject *)obj_local);
    uStack_138 = (ulong)uVar7;
    puVar15 = min<unsigned_long>((unsigned_long *)&args_local,&stack0xfffffffffffffec8);
    local_12c = (uint)*puVar15;
    for (autoReentrancyHandler_1._12_4_ = 0; (uint)autoReentrancyHandler_1._12_4_ < local_12c;
        autoReentrancyHandler_1._12_4_ = autoReentrancyHandler_1._12_4_ + 1) {
      iVar8 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])
                        (obj_local,(ulong)(uint)autoReentrancyHandler_1._12_4_);
      mappedValue = (Var)CONCAT44(extraout_var,iVar8);
      JsReentLock::unlock((JsReentLock *)local_70);
      pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_150,pTVar9);
      pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar9);
      pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::AssertJsReentrancy(pTVar9);
      pvVar10 = thisArg;
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      CheckIsExecutable((RecyclableObject *)pvVar10,p_Var13);
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      pvVar5 = thisArg;
      pJVar4 = defaultConstructor;
      pvVar10 = mappedValue;
      CVar2 = _gotItem;
      pvVar14 = JavascriptNumber::ToVar
                          (autoReentrancyHandler_1._12_4_,(ScriptContext *)jsReentLock._24_8_);
      callBackFnInfo =
           (CallInfo)
           (*p_Var13)((RecyclableObject *)pvVar5,(CallInfo)pvVar5,CVar2,0,0,0,0,CVar2,pJVar4,pvVar10
                      ,pvVar14,length_local);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_150);
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
      JsReentLock::relock((JsReentLock *)local_70);
      if (pTStack_128 == (TypedArrayBase *)0x0) {
        (*(pJStack_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJStack_90,(ulong)(uint)autoReentrancyHandler_1._12_4_,callBackFnInfo,0);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_70);
        (*(pTStack_128->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])
                  (pTStack_128,(ulong)(uint)autoReentrancyHandler_1._12_4_,callBackFnInfo);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        JsReentLock::relock((JsReentLock *)local_70);
      }
    }
  }
  else {
    if ((Arguments *)0xffffffff < args_local) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2609,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    for (autoReentrancyHandler._12_4_ = 0; (uint)autoReentrancyHandler._12_4_ < (uint)args_local;
        autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_70);
      autoReentrancyHandler._8_4_ =
           (*(typedArrayBase_local->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
             super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[0x71])
                     (typedArrayBase_local,(ulong)(uint)autoReentrancyHandler._12_4_,&mappedValue);
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
      JsReentLock::relock((JsReentLock *)local_70);
      if (autoReentrancyHandler._8_4_ != 0) {
        JsReentLock::unlock((JsReentLock *)local_70);
        pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_108,pTVar9);
        pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar9);
        pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
        ThreadContext::AssertJsReentrancy(pTVar9);
        pvVar10 = thisArg;
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
        CheckIsExecutable((RecyclableObject *)pvVar10,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
        pvVar5 = thisArg;
        pJVar4 = defaultConstructor;
        pvVar10 = mappedValue;
        local_110 = _gotItem;
        local_118 = _gotItem;
        pvVar14 = JavascriptNumber::ToVar
                            (autoReentrancyHandler._12_4_,(ScriptContext *)jsReentLock._24_8_);
        callBackFnInfo =
             (CallInfo)
             (*p_Var13)((RecyclableObject *)pvVar5,(CallInfo)pvVar5,local_110,0,0,0,0,local_118,
                        pJVar4,pvVar10,pvVar14,typedArrayBase_local);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_108);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        JsReentLock::relock((JsReentLock *)local_70);
        if ((pJStack_90 == (JavascriptArray *)0x0) || ((callBackFn._6_1_ & 1) == 0)) {
          JsReentLock::unlock((JsReentLock *)local_70);
          succeeded = SetArrayLikeObjects((RecyclableObject *)newArr,autoReentrancyHandler._12_4_,
                                          (Var)callBackFnInfo);
          ThrowErrorOnFailure(succeeded,(ScriptContext *)jsReentLock._24_8_,
                              autoReentrancyHandler._12_4_);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
        }
        else {
          DirectSetItemAt<void*>(pJStack_90,autoReentrancyHandler._12_4_,(Var)callBackFnInfo);
        }
        bVar6 = IsNonES5Array((Var)length_local);
        if (!bVar6) {
          bVar6 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)length_local);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x262b,"(VarIs<ES5Array>(obj))",
                                        "The array should have been converted to an ES5Array");
            if (!bVar6) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          JsReentLock::unlock((JsReentLock *)local_70);
          pArr_local = (JavascriptArray *)
                       MapObjectHelper<unsigned_long>
                                 ((RecyclableObject *)length_local,(unsigned_long)args_local,
                                  (ulong)(autoReentrancyHandler._12_4_ + 1),
                                  (RecyclableObject *)newArr,pJStack_90,(bool)(callBackFn._6_1_ & 1)
                                  ,(RecyclableObject *)thisArg,defaultConstructor,
                                  (ScriptContext *)jsReentLock._24_8_);
          goto LAB_01103d44;
        }
      }
    }
  }
  bVar6 = IsNonES5Array(newArr);
  if (bVar6) {
    (*(pJStack_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  pArr_local = newArr;
LAB_01103d44:
  newTypedArray._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_70);
  return pArr_local;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }